

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O2

void __thiscall
ParseNodeName::ParseNodeName
          (ParseNodeName *this,charcount_t ichMin,charcount_t ichLim,IdentPtr name)

{
  (this->super_ParseNode).nop = knopName;
  (this->super_ParseNode).grfpn = 0;
  (this->super_ParseNode).location = 0xffffffff;
  (this->super_ParseNode).field_0x1 = ((this->super_ParseNode).field_0x1 & 0xe0) + 1;
  (this->super_ParseNode).ichMin = ichMin;
  (this->super_ParseNode).ichLim = ichLim;
  this->pid = name;
  this->symRef = (Symbol **)0x0;
  this->sym = (Symbol *)0x0;
  this->isSpecialName = false;
  return;
}

Assistant:

ParseNodeName::ParseNodeName(charcount_t ichMin, charcount_t ichLim, IdentPtr name)
    : ParseNode(knopName, ichMin, ichLim), pid(name)
{     
    this->sym = nullptr;    
    this->symRef = nullptr;
    this->isSpecialName = false;
}